

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.hpp
# Opt level: O2

ssize_t __thiscall
jsoncons::csv::basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_>::read
          (basic_csv_reader<char,_jsoncons::string_source<char>,_std::allocator<char>_> *this,
          int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  ser_error *this_00;
  error_code ec_00;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  read_internal(this,&ec);
  if (ec._M_value == 0) {
    return extraout_RAX;
  }
  this_00 = (ser_error *)__cxa_allocate_exception(0x58);
  ec_00._4_4_ = 0;
  ec_00._M_value = ec._M_value;
  ec_00._M_cat = ec._M_cat;
  ser_error::ser_error(this_00,ec_00,(this->parser_).line_,(this->parser_).column_);
  __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

void read()
        {
            std::error_code ec;
            read(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec,parser_.line(),parser_.column()));
            }
        }